

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void CVmObjTable::call_post_load_init(CVmHashEntryPLI *entry)

{
  vm_val_t *this;
  CVmObject *pCVar1;
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x28) == 0) {
    *(undefined4 *)(in_RDI + 0x28) = 1;
    this = CVmStack::push();
    vm_val_t::set_obj(this,*(vm_obj_id_t *)(in_RDI + 0x24));
    pCVar1 = vm_objp(0);
    (*pCVar1->_vptr_CVmObject[0x18])(pCVar1,(ulong)*(uint *)(in_RDI + 0x24));
    *(undefined4 *)(in_RDI + 0x28) = 2;
    CVmStack::discard();
  }
  else if (*(int *)(in_RDI + 0x28) == 1) {
    err_throw(0);
  }
  return;
}

Assistant:

void CVmObjTable::call_post_load_init(VMG_ CVmHashEntryPLI *entry)
{
    /* check the status */
    switch (entry->status)
    {
    case PLI_UNINITED:
        /*  
         *   It's not yet initialized, so we need to initialize it now.  Mark
         *   it as having its initialization in progress.  
         */
        entry->status = PLI_IN_PROGRESS;

        /* 
         *   push the entry on the stack to protect it from gc while we're
         *   initializing it 
         */
        G_stk->push()->set_obj(entry->id_);

        /* invoke its initialization */
        vm_objp(vmg_ entry->id_)->post_load_init(vmg_ entry->id_);

        /* mark the object as having completed initialization */
        entry->status = PLI_INITED;

        /* discard our GC protection */
        G_stk->discard();

        /* done */
        break;

    case PLI_IN_PROGRESS:
        /*
         *   The object is in the process of being initialized.  This must
         *   mean that the object's initializer is calling us indirectly,
         *   probably through another object's initializer that it invoked
         *   explicitly as a dependency, which in turn means that we have a
         *   circular dependency.  This is illegal, so abort with an error.  
         */
        err_throw(VMERR_CIRCULAR_INIT);
        break;

    case PLI_INITED:
        /* it's already been initialized, so there's nothing to do */
        break;
    }
}